

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_ULong cff_index_read_offset(CFF_Index idx,FT_Error *errorp)

{
  FT_Error FVar1;
  int local_3c;
  ulong uStack_38;
  FT_Int nn;
  FT_ULong result;
  FT_Stream pFStack_28;
  FT_Byte tmp [4];
  FT_Stream stream;
  FT_Error error;
  FT_Error *errorp_local;
  CFF_Index idx_local;
  
  pFStack_28 = idx->stream;
  uStack_38 = 0;
  FVar1 = FT_Stream_Read(pFStack_28,(FT_Byte *)((long)&result + 4),(ulong)idx->off_size);
  if (FVar1 == 0) {
    for (local_3c = 0; local_3c < (int)(uint)idx->off_size; local_3c = local_3c + 1) {
      uStack_38 = uStack_38 << 8 | (ulong)*(byte *)((long)&result + (long)local_3c + 4);
    }
  }
  *errorp = FVar1;
  return uStack_38;
}

Assistant:

static FT_ULong
  cff_index_read_offset( CFF_Index  idx,
                         FT_Error  *errorp )
  {
    FT_Error   error;
    FT_Stream  stream = idx->stream;
    FT_Byte    tmp[4];
    FT_ULong   result = 0;


    if ( !FT_STREAM_READ( tmp, idx->off_size ) )
    {
      FT_Int  nn;


      for ( nn = 0; nn < idx->off_size; nn++ )
        result = ( result << 8 ) | tmp[nn];
    }

    *errorp = error;
    return result;
  }